

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_deconvolutiondepthwise.cpp
# Opt level: O2

int main(void)

{
  int outch;
  int kernel;
  int dilation;
  ulong uVar1;
  int iVar2;
  int iVar3;
  undefined8 in_RAX;
  long lVar4;
  uint64_t uVar5;
  ulong uVar6;
  undefined8 unaff_RBX;
  int *piVar7;
  prng_rand_t *in_RDI;
  bool bVar8;
  
  g_prng_rand_state.c = 0x37;
  g_prng_rand_state.i = 0;
  g_prng_rand_state.s[0] = 0x7685dd;
  uVar5 = 0x807685dc;
  for (lVar4 = 1; lVar4 != 0x40; lVar4 = lVar4 + 1) {
    g_prng_rand_state.s[lVar4] = uVar5;
    uVar5 = uVar5 + 0x7fffffff;
  }
  lVar4 = 10000;
  while (bVar8 = lVar4 != 0, lVar4 = lVar4 + -1, bVar8) {
    prng_rand(in_RDI);
  }
  piVar7 = &DAT_0015b03c;
  uVar1 = 0;
  do {
    uVar6 = uVar1;
    if (uVar6 == 0x10) break;
    iVar3 = piVar7[-3];
    outch = piVar7[-2];
    kernel = piVar7[-1];
    dilation = *piVar7;
    iVar2 = test_deconvolutiondepthwise
                      (1,1,iVar3,outch,kernel,dilation,1,1,(int)in_RAX,(int)unaff_RBX);
    if (iVar2 != 0) break;
    iVar2 = test_deconvolutiondepthwise
                      (2,2,iVar3,outch,kernel,dilation,0,1,(int)in_RAX,(int)unaff_RBX);
    if (iVar2 != 0) break;
    iVar2 = test_deconvolutiondepthwise
                      (2,2,iVar3,outch,kernel,dilation,1,2,(int)in_RAX,(int)unaff_RBX);
    if (iVar2 != 0) break;
    iVar2 = test_deconvolutiondepthwise
                      (3,3,iVar3,outch,kernel,dilation,0,3,(int)in_RAX,(int)unaff_RBX);
    if (iVar2 != 0) break;
    iVar2 = test_deconvolutiondepthwise
                      (4,2,iVar3,outch,kernel,dilation,1,2,(int)in_RAX,(int)unaff_RBX);
    if (iVar2 != 0) break;
    iVar2 = test_deconvolutiondepthwise
                      (4,4,iVar3,outch,kernel,dilation,0,4,(int)in_RAX,(int)unaff_RBX);
    if (iVar2 != 0) break;
    iVar2 = test_deconvolutiondepthwise
                      (7,7,iVar3,outch,kernel,dilation,1,7,(int)in_RAX,(int)unaff_RBX);
    if (iVar2 != 0) break;
    iVar2 = test_deconvolutiondepthwise
                      (8,8,iVar3,outch,kernel,dilation,0,2,(int)in_RAX,(int)unaff_RBX);
    if (iVar2 != 0) break;
    iVar2 = test_deconvolutiondepthwise
                      (8,8,iVar3,outch,kernel,dilation,1,8,(int)in_RAX,(int)unaff_RBX);
    if (iVar2 != 0) break;
    iVar2 = test_deconvolutiondepthwise
                      (0xc,0xc,iVar3,outch,kernel,dilation,0,4,(int)in_RAX,(int)unaff_RBX);
    if (iVar2 != 0) break;
    iVar2 = test_deconvolutiondepthwise
                      (0xf,0xf,iVar3,outch,kernel,dilation,1,0xf,(int)in_RAX,(int)unaff_RBX);
    if (iVar2 != 0) break;
    iVar2 = test_deconvolutiondepthwise
                      (0x10,8,iVar3,outch,kernel,dilation,0,2,(int)in_RAX,(int)unaff_RBX);
    if (iVar2 != 0) break;
    iVar3 = test_deconvolutiondepthwise
                      (0x10,0x10,iVar3,outch,kernel,dilation,1,0x10,(int)in_RAX,(int)unaff_RBX);
    piVar7 = piVar7 + 4;
    uVar1 = uVar6 + 1;
  } while (iVar3 == 0);
  return -(uint)(uVar6 < 0x10);
}

Assistant:

int main()
{
    SRAND(7767517);

    return test_deconvolutiondepthwise_0();
}